

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbfTopic.c
# Opt level: O1

sbfTopic sbfTopic_create(sbfTopicType type,char *string)

{
  char cVar1;
  size_t sVar2;
  sbfTopic topic;
  char *pcVar3;
  char *pcVar4;
  char *pcVar5;
  char *cp;
  char *local_30;
  
  sVar2 = strlen(string);
  topic = (sbfTopic)sbfMemory_calloc(1,0x28);
  topic->mType = type;
  pcVar3 = (char *)sbfMemory_malloc(sVar2 + 1);
  local_30 = pcVar3;
  for (pcVar5 = string + 2; (cVar1 = pcVar5[-2], cVar1 != '\0' && (cVar1 != '/'));
      pcVar5 = pcVar5 + 1) {
    *local_30 = cVar1;
    local_30 = local_30 + 1;
  }
  *local_30 = '\0';
  if (pcVar5[-2] == '\0') {
    pcVar5 = (char *)sbfMemory_strdup("");
    topic->mFirst = pcVar5;
    pcVar5 = (char *)sbfMemory_strdup("");
    topic->mSecond = pcVar5;
  }
  else {
    pcVar4 = (char *)sbfMemory_malloc(sVar2 + 1);
    local_30 = pcVar4;
    for (; (cVar1 = pcVar5[-1], cVar1 != '\0' && (cVar1 != '/')); pcVar5 = pcVar5 + 1) {
      *local_30 = cVar1;
      local_30 = local_30 + 1;
    }
    *local_30 = '\0';
    if (pcVar5[-1] == '\0') {
      pcVar5 = (char *)sbfMemory_strdup("");
      topic->mFirst = pcVar5;
      topic->mSecond = pcVar3;
      pcVar3 = pcVar4;
    }
    else {
      topic->mFirst = pcVar3;
      topic->mSecond = pcVar4;
      pcVar3 = (char *)sbfMemory_strdup(pcVar5);
    }
  }
  topic->mThird = pcVar3;
  sbfMemory_asprintf(&local_30,"%s/%s/%s",topic->mFirst,topic->mSecond,pcVar3);
  topic->mTopic = local_30;
  sVar2 = strlen(local_30);
  if (0xff < sVar2) {
    sbfTopic_destroy(topic);
    topic = (sbfTopic)0x0;
  }
  return topic;
}

Assistant:

sbfTopic
sbfTopic_create (sbfTopicType type, const char* string)
{
    sbfTopic topic;
    size_t   size;
    char*    first;
    char*    second;
    char*    cp;

    size = strlen (string) + 1;

    topic = xcalloc (1, sizeof *topic);
    topic->mType = type;

    cp = first = xmalloc (size);
    while (*string != '\0' && *string != '/')
        *cp++ = *string++;
    *cp = '\0';
    if (*string == '\0')
    {
        topic->mFirst = xstrdup ("");
        topic->mSecond = xstrdup ("");
        topic->mThird = first;
        goto out;
    }
    string++;

    cp = second = xmalloc (size);
    while (*string != '\0' && *string != '/')
        *cp++ = *string++;
    *cp = '\0';
    if (*string == '\0')
    {
        topic->mFirst = xstrdup ("");
        topic->mSecond = first;
        topic->mThird = second;
        goto out;
    }
    string++;

    topic->mFirst = first;
    topic->mSecond = second;
    topic->mThird = xstrdup (string);

out:
    xasprintf (&cp, "%s/%s/%s", topic->mFirst, topic->mSecond, topic->mThird);
    topic->mTopic = cp;

    if (strlen (topic->mTopic) > SBF_TOPIC_SIZE_LIMIT)
    {
        sbfTopic_destroy (topic);
        return NULL;
    }
    return topic;
}